

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O3

void __thiscall maxNodeHeap::insert(maxNodeHeap *this,NodeID node,Gain gain)

{
  pointer ppVar1;
  pointer pQVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int __tmp;
  ulong uVar8;
  int iVar9;
  NodeID local_54;
  vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_> *local_50;
  QElement<maxNodeHeap::Data> local_48;
  
  local_54 = node;
  iVar3 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_element_index)._M_h,&local_54);
  if (iVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur == (__node_type *)0x0
     ) {
    local_50 = &this->m_elements;
    iVar9 = (int)((ulong)((long)(this->m_elements).
                                super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_elements).
                               super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    uVar8 = (ulong)((long)(this->m_heap).
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_heap).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    local_48._vptr_QElement = (_func_int **)&PTR__QElement_0012cd50;
    local_48.m_data.node = local_54;
    local_48.m_key = gain;
    local_48.m_index = (int)uVar8;
    std::vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>>::
    emplace_back<QElement<maxNodeHeap::Data>>
              ((vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>> *)
               local_50,&local_48);
    local_48._vptr_QElement = (_func_int **)CONCAT44(iVar9,gain);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_heap,
               (pair<int,_int> *)&local_48);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->m_element_index,&local_54);
    *pmVar4 = iVar9;
    if (0 < (int)uVar8) {
      ppVar1 = (this->m_heap).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pQVar2 = (local_50->
               super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar5 = (int)uVar8 - 1;
        uVar6 = uVar5 >> 1;
        iVar9 = ppVar1[uVar6].first;
        uVar7 = uVar8 & 0xffffffff;
        if (ppVar1[uVar7].first <= iVar9) {
          return;
        }
        ppVar1[uVar6].first = ppVar1[uVar7].first;
        ppVar1[uVar7].first = iVar9;
        iVar9 = ppVar1[uVar6].second;
        ppVar1[uVar6].second = ppVar1[uVar7].second;
        ppVar1[uVar7].second = iVar9;
        pQVar2[iVar9].m_index = (int)uVar8;
        pQVar2[ppVar1[uVar6].second].m_index = uVar6;
        uVar8 = (ulong)uVar6;
      } while (1 < uVar5);
    }
  }
  return;
}

Assistant:

inline void maxNodeHeap::insert(NodeID node, Gain gain) {
        if( m_element_index.find(node) == m_element_index.end() ) {
                int element_index =  m_elements.size();
                int heap_size     =  m_heap.size();

                m_elements.push_back( PQElement( Data(node), gain, heap_size) );
                m_heap.push_back( std::pair< Key, int>(gain, element_index) );
                m_element_index[node] = element_index;
                siftUp( heap_size );
        }
}